

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

byte * __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetRealAddressFromInterior
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *interiorAddress)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  undefined8 *in_FS_OFFSET;
  ushort index;
  void *interiorAddress_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  if ((this->super_HeapBlock).address <= interiorAddress) {
    pcVar1 = (this->super_HeapBlock).address;
    uVar5 = GetPageCount(this);
    if (interiorAddress < pcVar1 + (uVar5 << 0xc)) goto LAB_00292e51;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *(undefined4 *)*in_FS_OFFSET = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                     ,0x308,
                     "(interiorAddress >= this->address && interiorAddress < this->address + AutoSystemInfo::PageSize * this->GetPageCount())"
                     ,
                     "interiorAddress >= this->address && interiorAddress < this->address + AutoSystemInfo::PageSize * this->GetPageCount()"
                    );
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *(undefined4 *)*in_FS_OFFSET = 0;
LAB_00292e51:
  uVar4 = GetInteriorAddressIndex(this,interiorAddress);
  if (uVar4 == 0xffff) {
    this_local = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  }
  else {
    pcVar1 = (this->super_HeapBlock).address;
    uVar5 = GetObjectSize(this);
    this_local = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)(pcVar1 + uVar4 * uVar5);
  }
  return (byte *)this_local;
}

Assistant:

byte *
SmallHeapBlockT<TBlockAttributes>::GetRealAddressFromInterior(void * interiorAddress)
{
    Assert(interiorAddress >= this->address && interiorAddress < this->address + AutoSystemInfo::PageSize * this->GetPageCount());
    ushort index = GetInteriorAddressIndex(interiorAddress);
    if (index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return (byte *)this->address + index * this->GetObjectSize();
    }
    return nullptr;
}